

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O0

void spell_rites_of_preparation(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  int in_EDI;
  bool hasgroup;
  AFFECT_DATA af;
  CHAR_DATA *to;
  undefined7 in_stack_ffffffffffffff68;
  byte bVar2;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  CHAR_DATA *local_28;
  
  bVar2 = 0;
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    for (local_28 = in_RDX->in_room->people; local_28 != (CHAR_DATA *)0x0;
        local_28 = local_28->next_in_room) {
      bVar1 = is_same_group(local_28,in_RDX);
      if ((bVar1) && (local_28 != in_RDX)) {
        bVar2 = 1;
        bVar1 = is_same_group(local_28,in_RDX);
        if ((bVar1) &&
           ((bVar1 = is_npc((CHAR_DATA *)CONCAT17(bVar2,in_stack_ffffffffffffff68)), !bVar1 &&
            (bVar1 = is_affected(local_28,in_EDI), !bVar1)))) {
          local_28->pcdata->condition[3] = 0;
          local_28->pcdata->condition[2] = 0;
          init_affect((AFFECT_DATA *)0x763af3);
          affect_to_char(in_stack_ffffffffffffff70,
                         (AFFECT_DATA *)CONCAT17(bVar2,in_stack_ffffffffffffff68));
          affect_to_char(in_stack_ffffffffffffff70,
                         (AFFECT_DATA *)CONCAT17(bVar2,in_stack_ffffffffffffff68));
          affect_to_char(in_stack_ffffffffffffff70,
                         (AFFECT_DATA *)CONCAT17(bVar2,in_stack_ffffffffffffff68));
        }
      }
    }
    if ((bVar2 & 1) == 0) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          (void *)CONCAT17(bVar2,in_stack_ffffffffffffff68),0);
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          (void *)CONCAT17(bVar2,in_stack_ffffffffffffff68),0);
      init_affect((AFFECT_DATA *)0x763c9b);
      affect_to_char(in_stack_ffffffffffffff70,
                     (AFFECT_DATA *)CONCAT17(bVar2,in_stack_ffffffffffffff68));
    }
  }
  return;
}

Assistant:

void spell_rites_of_preparation(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *to;
	AFFECT_DATA af;
	bool hasgroup= false;

	if (is_affected(ch, sn))
	{
		send_to_char("You cannot focus on preparing your party for battle again so soon.\n\r", ch);
		return;
	}

	for (to = ch->in_room->people; to != nullptr; to = to->next_in_room)
	{
		if (is_same_group(to, ch) && to != ch)
			hasgroup = true;
		else
			continue;

		if (is_same_group(to, ch) && !is_npc(to) && !is_affected(to, sn))
		{
			to->pcdata->condition[COND_HUNGER] = 0;
			to->pcdata->condition[COND_THIRST] = 0;

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.modifier = (ch->level / 7);
			af.location = APPLY_HITROLL;
			af.duration = 24;
			af.level = ch->level;
			affect_to_char(to, &af);

			af.type = sn;
			af.modifier = (ch->level / 7);
			af.location = APPLY_DAMROLL;
			af.duration = 24;
			af.level = ch->level;
			affect_to_char(to, &af);

			af.type = sn;
			af.modifier = -(ch->level / 8);
			af.location = APPLY_SAVES;
			af.duration = 24;
			af.aftype = AFT_COMMUNE;
			af.level = ch->level;
			affect_to_char(to, &af);
		}
	}

	if (hasgroup == false)
	{
		send_to_char("You need a party to perform these rites.\n\r", ch);
		return;
	}
	else
	{
		act("You recite some prayers to those in your party, bolstering their confidence and preparing them for battle.", ch, 0, 0, TO_CHAR);
		act("$n recites some prayers in a loud and confident voice, preparing you for righteous battle.", ch, 0, 0, TO_GROUP);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = sn;
		af.aftype = AFT_TIMER;
		af.level = ch->level;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.duration = 48;
		affect_to_char(ch, &af);
	}
}